

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * GenImageGradientRadial
                  (Image *__return_storage_ptr__,int width,int height,float density,Color inner,
                  Color outer)

{
  void *pvVar1;
  float fVar2;
  float local_5c;
  float factor;
  float dist;
  int x;
  int y;
  float centerY;
  float centerX;
  float radius;
  Color *pixels;
  float density_local;
  int height_local;
  int width_local;
  Color outer_local;
  Color inner_local;
  
  pvVar1 = malloc((long)(width * height) << 2);
  if (width < height) {
    local_5c = (float)width;
  }
  else {
    local_5c = (float)height;
  }
  local_5c = local_5c / 2.0;
  for (dist = 0.0; (int)dist < height; dist = (float)((int)dist + 1)) {
    for (factor = 0.0; (int)factor < width; factor = (float)((int)factor + 1)) {
      fVar2 = hypotf((float)(int)factor - (float)width / 2.0,(float)(int)dist - (float)height / 2.0)
      ;
      fVar2 = (fVar2 - local_5c * density) / (local_5c * (1.0 - density));
      if (fVar2 <= 0.0) {
        fVar2 = 0.0;
      }
      if (1.0 <= fVar2) {
        fVar2 = 1.0;
      }
      *(char *)((long)pvVar1 + (long)((int)dist * width + (int)factor) * 4) =
           (char)(int)((float)((uint)outer & 0xff) * fVar2 +
                      (float)((uint)inner & 0xff) * (1.0 - fVar2));
      *(char *)((long)pvVar1 + (long)((int)dist * width + (int)factor) * 4 + 1) =
           (char)(int)((float)((uint)outer >> 8 & 0xff) * fVar2 +
                      (float)((uint)inner >> 8 & 0xff) * (1.0 - fVar2));
      *(char *)((long)pvVar1 + (long)((int)dist * width + (int)factor) * 4 + 2) =
           (char)(int)((float)((uint)outer >> 0x10 & 0xff) * fVar2 +
                      (float)((uint)inner >> 0x10 & 0xff) * (1.0 - fVar2));
      *(char *)((long)pvVar1 + (long)((int)dist * width + (int)factor) * 4 + 3) =
           (char)(int)((float)((uint)outer >> 0x18) * fVar2 +
                      (float)((uint)inner >> 0x18) * (1.0 - fVar2));
    }
  }
  __return_storage_ptr__->data = pvVar1;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientRadial(int width, int height, float density, Color inner, Color outer)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));
    float radius = (width < height)? (float)width/2.0f : (float)height/2.0f;

    float centerX = (float)width/2.0f;
    float centerY = (float)height/2.0f;

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            float dist = hypotf((float)x - centerX, (float)y - centerY);
            float factor = (dist - radius*density)/(radius*(1.0f - density));

            factor = (float)fmax(factor, 0.0f);
            factor = (float)fmin(factor, 1.f); // dist can be bigger than radius so we have to check

            pixels[y*width + x].r = (int)((float)outer.r*factor + (float)inner.r*(1.0f - factor));
            pixels[y*width + x].g = (int)((float)outer.g*factor + (float)inner.g*(1.0f - factor));
            pixels[y*width + x].b = (int)((float)outer.b*factor + (float)inner.b*(1.0f - factor));
            pixels[y*width + x].a = (int)((float)outer.a*factor + (float)inner.a*(1.0f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}